

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderTextureGatherTests.cpp
# Opt level: O0

void vkt::sr::anon_unknown_0::swizzleTexture
               (TextureCube *dst,TextureCube *src,MaybeTextureSwizzle *swizzle)

{
  bool bVar1;
  int iVar2;
  TextureFormat *format;
  PixelBufferAccess *dst_00;
  ConstPixelBufferAccess *src_00;
  int local_1a0;
  int levelNdx;
  CubeFace face;
  int faceI;
  TextureCube local_188;
  MaybeTextureSwizzle *local_20;
  MaybeTextureSwizzle *swizzle_local;
  TextureCube *src_local;
  TextureCube *dst_local;
  
  local_20 = swizzle;
  swizzle_local = (MaybeTextureSwizzle *)src;
  src_local = dst;
  format = tcu::TextureCube::getFormat(src);
  iVar2 = tcu::TextureCube::getSize((TextureCube *)swizzle_local);
  tcu::TextureCube::TextureCube(&local_188,format,iVar2);
  tcu::TextureCube::operator=(src_local,&local_188);
  tcu::TextureCube::~TextureCube(&local_188);
  for (levelNdx = 0; levelNdx < 6; levelNdx = levelNdx + 1) {
    for (local_1a0 = 0; iVar2 = tcu::TextureCube::getNumLevels((TextureCube *)swizzle_local),
        local_1a0 < iVar2; local_1a0 = local_1a0 + 1) {
      bVar1 = tcu::TextureCube::isLevelEmpty((TextureCube *)swizzle_local,levelNdx,local_1a0);
      if (!bVar1) {
        tcu::TextureCube::allocLevel(src_local,levelNdx,local_1a0);
        dst_00 = tcu::TextureCube::getLevelFace(src_local,local_1a0,levelNdx);
        src_00 = tcu::TextureCube::getLevelFace((TextureCube *)swizzle_local,local_1a0,levelNdx);
        swizzlePixels(dst_00,src_00,local_20);
      }
    }
  }
  return;
}

Assistant:

static void swizzleTexture (tcu::TextureCube& dst, const tcu::TextureCube& src, const MaybeTextureSwizzle& swizzle)
{
	dst = tcu::TextureCube(src.getFormat(), src.getSize());
	for (int faceI = 0; faceI < tcu::CUBEFACE_LAST; faceI++)
	{
		const tcu::CubeFace face = (tcu::CubeFace)faceI;
		for (int levelNdx = 0; levelNdx < src.getNumLevels(); levelNdx++)
		{
			if (src.isLevelEmpty(face, levelNdx))
				continue;
			dst.allocLevel(face, levelNdx);
			swizzlePixels(dst.getLevelFace(levelNdx, face), src.getLevelFace(levelNdx, face), swizzle);
		}
	}
}